

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<float,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,long param_2,ushort param_3,Type *param_4,int param_5)

{
  int iVar1;
  IDLOptions *pIVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = this->opts->indent_step;
  iVar3 = 0;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  if (param_3 != 0) {
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        pIVar2 = this->opts;
        if (pIVar2->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
          pIVar2 = this->opts;
        }
        if (-1 < pIVar2->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar3 + param_5));
      PrintScalar<float>(this,*(float *)(param_2 + uVar4 * 4),param_4,iVar3 + param_5);
      uVar4 = uVar4 + 1;
    } while (param_3 != uVar4);
  }
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *PrintContainer(PrintScalarTag, const Container &c, SizeT size,
                             const Type &type, int indent, const uint8_t *) {
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      PrintScalar(c[i], type, elem_indent);
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }